

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::StringOutputStream::Next(StringOutputStream *this,void **data,int *size)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  int *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int old_size;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  LogMessage *in_stack_fffffffffffffef0;
  string *s;
  undefined8 in_stack_fffffffffffffef8;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff00;
  int local_bc;
  int local_b8 [2];
  LogMessage local_b0;
  int local_74;
  byte local_59;
  int *local_20;
  undefined8 *local_18;
  
  level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_59 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (*(long *)(in_RDI + 8) == 0) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff00,level,(char *)in_stack_fffffffffffffef0,
               in_stack_fffffffffffffeec);
    local_59 = 1;
    internal::LogMessage::operator<<
              (in_stack_fffffffffffffef0,
               (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffef0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x3cbd92);
  }
  local_74 = std::__cxx11::string::size();
  uVar5 = (ulong)local_74;
  uVar3 = std::__cxx11::string::capacity();
  iVar2 = local_74;
  if (uVar5 < uVar3) {
    std::__cxx11::string::capacity();
    STLStringResizeUninitialized
              ((string *)in_stack_fffffffffffffef0,
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  else {
    iVar1 = std::numeric_limits<int>::max();
    if (iVar1 / 2 < iVar2) {
      internal::LogMessage::LogMessage
                (&local_b0,level,(char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      internal::LogMessage::operator<<
                (in_stack_fffffffffffffef0,
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      internal::LogMessage::operator<<
                (in_stack_fffffffffffffef0,
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      internal::LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffef0,
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      internal::LogMessage::~LogMessage((LogMessage *)0x3cbebe);
      return false;
    }
    s = *(string **)(in_RDI + 8);
    local_b8[0] = local_74 << 1;
    local_bc = 0x10;
    std::max<int>(local_b8,&local_bc);
    STLStringResizeUninitialized(s,CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  pcVar4 = mutable_string_data((string *)0x3cbf3b);
  *local_18 = pcVar4 + local_74;
  iVar2 = std::__cxx11::string::size();
  *local_20 = iVar2 - local_74;
  return true;
}

Assistant:

bool StringOutputStream::Next(void** data, int* size) {
  GOOGLE_CHECK(target_ != NULL);
  int old_size = target_->size();

  // Grow the string.
  if (old_size < target_->capacity()) {
    // Resize the string to match its capacity, since we can get away
    // without a memory allocation this way.
    STLStringResizeUninitialized(target_, target_->capacity());
  } else {
    // Size has reached capacity, try to double the size.
    if (old_size > std::numeric_limits<int>::max() / 2) {
      // Can not double the size otherwise it is going to cause integer
      // overflow in the expression below: old_size * 2 ";
      GOOGLE_LOG(ERROR) << "Cannot allocate buffer larger than kint32max for "
                 << "StringOutputStream.";
      return false;
    }
    // Double the size, also make sure that the new size is at least
    // kMinimumSize.
    STLStringResizeUninitialized(
        target_,
        std::max(old_size * 2,
                 kMinimumSize + 0));  // "+ 0" works around GCC4 weirdness.
  }

  *data = mutable_string_data(target_) + old_size;
  *size = target_->size() - old_size;
  return true;
}